

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O1

string * muduo::ProcessInfo::hostname_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  char buf [256];
  char acStack_118 [255];
  undefined1 local_19;
  
  iVar1 = gethostname(acStack_118,0x100);
  if (iVar1 == 0) {
    local_19 = 0;
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(acStack_118);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

string ProcessInfo::hostname()
{
  // HOST_NAME_MAX 64
  // _POSIX_HOST_NAME_MAX 255
  char buf[256];
  if (::gethostname(buf, sizeof buf) == 0)
  {
    buf[sizeof(buf)-1] = '\0';
    return buf;
  }
  else
  {
    return "unknownhost";
  }
}